

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_hash.c
# Opt level: O1

ngx_int_t ngx_hash_add_key(ngx_hash_keys_arrays_t *ha,ngx_str_t *key,void *value,ngx_uint_t flags)

{
  byte bVar1;
  u_char uVar2;
  ngx_array_t *pnVar3;
  ngx_pool_t *pnVar4;
  u_char *puVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  void *pvVar10;
  size_t *psVar11;
  long lVar12;
  size_t *psVar13;
  size_t sVar14;
  long lVar15;
  ulong uVar16;
  size_t sVar17;
  ngx_int_t nVar18;
  size_t sVar19;
  byte bVar20;
  ngx_uint_t nVar21;
  ulong size;
  undefined8 *puVar22;
  u_char *local_40;
  
  size = key->len;
  if ((flags & 1) == 0) {
LAB_001154db:
    uVar9 = 0;
    if (size != 0) {
      uVar16 = 0;
      do {
        if ((flags & 2) == 0) {
          bVar1 = key->data[uVar16];
          bVar20 = bVar1 | 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar20 = bVar1;
          }
          key->data[uVar16] = bVar20;
        }
        uVar9 = (ulong)key->data[uVar16] + uVar9 * 0x1f;
        uVar16 = uVar16 + 1;
      } while (size != uVar16);
    }
    uVar9 = uVar9 % ha->hsize;
    pnVar3 = ha->keys_hash;
    if (pnVar3[uVar9].elts == (void *)0x0) {
      pnVar3 = pnVar3 + uVar9;
      pnVar4 = ha->temp_pool;
      pnVar3->nelts = 0;
      pnVar3->size = 0x10;
      pnVar3->nalloc = 4;
      pnVar3->pool = pnVar4;
      pvVar10 = ngx_palloc(pnVar4,0x40);
      pnVar3->elts = pvVar10;
      if (pvVar10 == (void *)0x0) goto LAB_00115a90;
    }
    else {
      nVar21 = pnVar3[uVar9].nelts;
      if (nVar21 != 0) {
        puVar22 = (undefined8 *)((long)pnVar3[uVar9].elts + 8);
        do {
          if ((size == puVar22[-1]) &&
             (iVar8 = strncmp((char *)key->data,(char *)*puVar22,size), iVar8 == 0)) {
            return -3;
          }
          puVar22 = puVar22 + 2;
          nVar21 = nVar21 - 1;
        } while (nVar21 != 0);
      }
    }
    psVar11 = (size_t *)ngx_array_push(ha->keys_hash + uVar9);
    if (psVar11 == (size_t *)0x0) {
      return -1;
    }
    puVar5 = key->data;
    *psVar11 = key->len;
    psVar11[1] = (size_t)puVar5;
    psVar11 = (size_t *)ngx_array_push(&ha->keys);
    if (psVar11 == (size_t *)0x0) {
      return -1;
    }
    puVar5 = key->data;
    *psVar11 = key->len;
    psVar11[1] = (size_t)puVar5;
    if (size == 0) {
LAB_00115a82:
      sVar14 = 0;
    }
    else {
      sVar14 = 0;
      uVar9 = 0;
      do {
        sVar14 = (ulong)key->data[uVar9] + sVar14 * 0x1f;
        uVar9 = uVar9 + 1;
      } while (size != uVar9);
    }
    psVar11[2] = sVar14;
    psVar11[3] = (size_t)value;
    nVar18 = 0;
  }
  else {
    if (size == 0) {
      bVar6 = true;
      uVar9 = 0;
    }
    else {
      bVar6 = false;
      uVar9 = 0;
      do {
        uVar2 = key->data[uVar9];
        bVar7 = bVar6;
        if ((uVar2 == '*') && (bVar7 = true, bVar6)) {
          return -5;
        }
        bVar6 = bVar7;
        if (uVar2 == '.') {
          if (key->data[uVar9 + 1] == '.') {
            return -5;
          }
        }
        else if (uVar2 == '\0') {
          return -5;
        }
        uVar9 = uVar9 + 1;
      } while (size != uVar9);
      bVar6 = !bVar6;
      uVar9 = size;
    }
    if ((size < 2) || (*key->data != '.')) {
      if (size < 3) {
LAB_00115754:
        if (!bVar6) {
          return -5;
        }
        goto LAB_001154db;
      }
      puVar5 = key->data;
      if ((*puVar5 == '*') && (puVar5[1] == '.')) {
        sVar14 = 2;
        bVar6 = false;
        goto LAB_001156e0;
      }
      if ((puVar5[uVar9 - 2] != '.') || (puVar5[uVar9 - 1] != '*')) goto LAB_00115754;
      size = size - 2;
      bVar7 = true;
      bVar6 = false;
      sVar14 = 0;
    }
    else {
      sVar14 = 1;
      bVar6 = true;
LAB_001156e0:
      bVar7 = false;
    }
    sVar17 = size - sVar14;
    if (sVar17 == 0) {
      uVar9 = 0;
    }
    else {
      puVar5 = key->data;
      uVar9 = 0;
      sVar19 = sVar14;
      do {
        bVar1 = puVar5[sVar19];
        bVar20 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar20 = bVar1;
        }
        puVar5[sVar19] = bVar20;
        uVar9 = (ulong)bVar20 + uVar9 * 0x1f;
        sVar19 = sVar19 + 1;
      } while (size != sVar19);
    }
    uVar9 = uVar9 % ha->hsize;
    if (bVar6) {
      pnVar3 = ha->keys_hash;
      if (pnVar3[uVar9].elts == (void *)0x0) {
        pnVar3 = pnVar3 + uVar9;
        pnVar4 = ha->temp_pool;
        pnVar3->nelts = 0;
        pnVar3->size = 0x10;
        pnVar3->nalloc = 4;
        pnVar3->pool = pnVar4;
        pvVar10 = ngx_palloc(pnVar4,0x40);
        pnVar3->elts = pvVar10;
        if (pvVar10 == (void *)0x0) goto LAB_00115a90;
      }
      else {
        nVar21 = pnVar3[uVar9].nelts;
        if (nVar21 != 0) {
          puVar22 = (undefined8 *)((long)pnVar3[uVar9].elts + 8);
          do {
            if ((sVar17 == puVar22[-1]) &&
               (iVar8 = strncmp((char *)(key->data + 1),(char *)*puVar22,sVar17), iVar8 == 0)) {
              return -3;
            }
            puVar22 = puVar22 + 2;
            nVar21 = nVar21 - 1;
          } while (nVar21 != 0);
        }
      }
      psVar11 = (size_t *)ngx_array_push(ha->keys_hash + uVar9);
      if (psVar11 == (size_t *)0x0) {
        return -1;
      }
      *psVar11 = size - 1;
      pvVar10 = ngx_pnalloc(ha->temp_pool,size - 1);
      psVar11[1] = (size_t)pvVar10;
      if (pvVar10 == (void *)0x0) {
        return -1;
      }
      memcpy(pvVar10,key->data + 1,*psVar11);
    }
    if (bVar7) {
      size = size + 1;
      local_40 = (u_char *)ngx_pnalloc(ha->temp_pool,size);
      if (local_40 != (u_char *)0x0) {
        ngx_cpystrn(local_40,key->data,size);
        lVar12 = 0xa0;
        lVar15 = 0x78;
LAB_00115965:
        pnVar3 = (ngx_array_t *)(*(long *)((long)&ha->hsize + lVar12) + uVar9 * 0x28);
        if (pnVar3->elts == (void *)0x0) {
          pnVar4 = ha->temp_pool;
          pnVar3->nelts = 0;
          pnVar3->size = 0x10;
          pnVar3->nalloc = 4;
          pnVar3->pool = pnVar4;
          pvVar10 = ngx_palloc(pnVar4,0x40);
          pnVar3->elts = pvVar10;
          if (pvVar10 == (void *)0x0) goto LAB_00115a90;
        }
        else {
          nVar21 = pnVar3->nelts;
          if (nVar21 != 0) {
            puVar22 = (undefined8 *)((long)pnVar3->elts + 8);
            do {
              if ((size - sVar14 == puVar22[-1]) &&
                 (iVar8 = strncmp((char *)(key->data + sVar14),(char *)*puVar22,size - sVar14),
                 iVar8 == 0)) {
                return -3;
              }
              puVar22 = puVar22 + 2;
              nVar21 = nVar21 - 1;
            } while (nVar21 != 0);
          }
        }
        psVar13 = (size_t *)ngx_array_push(pnVar3);
        if (psVar13 == (size_t *)0x0) {
          return -1;
        }
        *psVar13 = size - sVar14;
        pvVar10 = ngx_pnalloc(ha->temp_pool,size - sVar14);
        psVar13[1] = (size_t)pvVar10;
        if (pvVar10 == (void *)0x0) {
          return -1;
        }
        memcpy(pvVar10,key->data + sVar14,*psVar13);
        psVar11 = (size_t *)ngx_array_push((ngx_array_t *)((long)&ha->hsize + lVar15));
        if (psVar11 == (size_t *)0x0) {
          return -1;
        }
        *psVar11 = size - 1;
        psVar11[1] = (size_t)local_40;
        goto LAB_00115a82;
      }
    }
    else {
      local_40 = (u_char *)ngx_pnalloc(ha->temp_pool,size);
      if (local_40 != (u_char *)0x0) {
        if (size == 1) {
          sVar17 = 0;
          lVar12 = 0;
        }
        else {
          lVar12 = 0;
          sVar17 = 0;
          sVar19 = size;
          do {
            if (key->data[sVar19 - 1] == '.') {
              memcpy(local_40 + lVar12,key->data + sVar19,sVar17);
              lVar15 = lVar12 + sVar17;
              lVar12 = lVar12 + sVar17 + 1;
              local_40[lVar15] = '.';
              sVar17 = 0;
            }
            else {
              sVar17 = sVar17 + 1;
            }
            sVar19 = sVar19 - 1;
          } while (sVar19 != 1);
        }
        if (sVar17 != 0) {
          memcpy(local_40 + lVar12,key->data + 1,sVar17);
          lVar12 = lVar12 + sVar17;
        }
        local_40[lVar12] = '\0';
        lVar12 = 0x70;
        lVar15 = 0x48;
        goto LAB_00115965;
      }
    }
LAB_00115a90:
    nVar18 = -1;
  }
  return nVar18;
}

Assistant:

ngx_int_t
ngx_hash_add_key(ngx_hash_keys_arrays_t *ha, ngx_str_t *key, void *value,
    ngx_uint_t flags)
{
    size_t           len;
    u_char          *p;
    ngx_str_t       *name;
    ngx_uint_t       i, k, n, skip, last;
    ngx_array_t     *keys, *hwc;
    ngx_hash_key_t  *hk;

    last = key->len;

    if (flags & NGX_HASH_WILDCARD_KEY) {

        /*
         * supported wildcards:
         *     "*.example.com", ".example.com", and "www.example.*"
         */

        n = 0;

        for (i = 0; i < key->len; i++) {

            if (key->data[i] == '*') {
                if (++n > 1) {
                    return NGX_DECLINED;
                }
            }

            if (key->data[i] == '.' && key->data[i + 1] == '.') {
                return NGX_DECLINED;
            }

            if (key->data[i] == '\0') {
                return NGX_DECLINED;
            }
        }

        if (key->len > 1 && key->data[0] == '.') {
            skip = 1;
            goto wildcard;
        }

        if (key->len > 2) {

            if (key->data[0] == '*' && key->data[1] == '.') {
                skip = 2;
                goto wildcard;
            }

            if (key->data[i - 2] == '.' && key->data[i - 1] == '*') {
                skip = 0;
                last -= 2;
                goto wildcard;
            }
        }

        if (n) {
            return NGX_DECLINED;
        }
    }

    /* exact hash */

    k = 0;

    for (i = 0; i < last; i++) {
        if (!(flags & NGX_HASH_READONLY_KEY)) {
            key->data[i] = ngx_tolower(key->data[i]);
        }
        k = ngx_hash(k, key->data[i]);
    }

    k %= ha->hsize;

    /* check conflicts in exact hash */

    name = ha->keys_hash[k].elts;

    if (name) {
        for (i = 0; i < ha->keys_hash[k].nelts; i++) {
            if (last != name[i].len) {
                continue;
            }

            if (ngx_strncmp(key->data, name[i].data, last) == 0) {
                return NGX_BUSY;
            }
        }

    } else {
        if (ngx_array_init(&ha->keys_hash[k], ha->temp_pool, 4,
                           sizeof(ngx_str_t))
            != NGX_OK)
        {
            return NGX_ERROR;
        }
    }

    name = ngx_array_push(&ha->keys_hash[k]);
    if (name == NULL) {
        return NGX_ERROR;
    }

    *name = *key;

    hk = ngx_array_push(&ha->keys);
    if (hk == NULL) {
        return NGX_ERROR;
    }

    hk->key = *key;
    hk->key_hash = ngx_hash_key(key->data, last);
    hk->value = value;

    return NGX_OK;


wildcard:

    /* wildcard hash */

    k = ngx_hash_strlow(&key->data[skip], &key->data[skip], last - skip);

    k %= ha->hsize;

    if (skip == 1) {

        /* check conflicts in exact hash for ".example.com" */

        name = ha->keys_hash[k].elts;

        if (name) {
            len = last - skip;

            for (i = 0; i < ha->keys_hash[k].nelts; i++) {
                if (len != name[i].len) {
                    continue;
                }

                if (ngx_strncmp(&key->data[1], name[i].data, len) == 0) {
                    return NGX_BUSY;
                }
            }

        } else {
            if (ngx_array_init(&ha->keys_hash[k], ha->temp_pool, 4,
                               sizeof(ngx_str_t))
                != NGX_OK)
            {
                return NGX_ERROR;
            }
        }

        name = ngx_array_push(&ha->keys_hash[k]);
        if (name == NULL) {
            return NGX_ERROR;
        }

        name->len = last - 1;
        name->data = ngx_pnalloc(ha->temp_pool, name->len);
        if (name->data == NULL) {
            return NGX_ERROR;
        }

        ngx_memcpy(name->data, &key->data[1], name->len);
    }


    if (skip) {

        /*
         * convert "*.example.com" to "com.example.\0"
         *      and ".example.com" to "com.example\0"
         */

        p = ngx_pnalloc(ha->temp_pool, last);
        if (p == NULL) {
            return NGX_ERROR;
        }

        len = 0;
        n = 0;

        for (i = last - 1; i; i--) {
            if (key->data[i] == '.') {
                ngx_memcpy(&p[n], &key->data[i + 1], len);
                n += len;
                p[n++] = '.';
                len = 0;
                continue;
            }

            len++;
        }

        if (len) {
            ngx_memcpy(&p[n], &key->data[1], len);
            n += len;
        }

        p[n] = '\0';

        hwc = &ha->dns_wc_head;
        keys = &ha->dns_wc_head_hash[k];

    } else {

        /* convert "www.example.*" to "www.example\0" */

        last++;

        p = ngx_pnalloc(ha->temp_pool, last);
        if (p == NULL) {
            return NGX_ERROR;
        }

        ngx_cpystrn(p, key->data, last);

        hwc = &ha->dns_wc_tail;
        keys = &ha->dns_wc_tail_hash[k];
    }


    /* check conflicts in wildcard hash */

    name = keys->elts;

    if (name) {
        len = last - skip;

        for (i = 0; i < keys->nelts; i++) {
            if (len != name[i].len) {
                continue;
            }

            if (ngx_strncmp(key->data + skip, name[i].data, len) == 0) {
                return NGX_BUSY;
            }
        }

    } else {
        if (ngx_array_init(keys, ha->temp_pool, 4, sizeof(ngx_str_t)) != NGX_OK)
        {
            return NGX_ERROR;
        }
    }

    name = ngx_array_push(keys);
    if (name == NULL) {
        return NGX_ERROR;
    }

    name->len = last - skip;
    name->data = ngx_pnalloc(ha->temp_pool, name->len);
    if (name->data == NULL) {
        return NGX_ERROR;
    }

    ngx_memcpy(name->data, key->data + skip, name->len);


    /* add to wildcard hash */

    hk = ngx_array_push(hwc);
    if (hk == NULL) {
        return NGX_ERROR;
    }

    hk->key.len = last - 1;
    hk->key.data = p;
    hk->key_hash = 0;
    hk->value = value;

    return NGX_OK;
}